

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O0

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::MouseEvent,QWindow*,unsigned_long,QPointF,QPointF,QFlags<Qt::MouseButton>,QFlags<Qt::KeyboardModifier>,Qt::MouseButton,QEvent::Type,Qt::MouseEventSource,bool,QPointingDevice_const*>
               (QWindow *args,unsigned_long args_1,QPointF args_2,QPointF args_3,
               QFlags<Qt::MouseButton> args_4,QFlags<Qt::KeyboardModifier> args_5,MouseButton args_6
               ,Type args_7,MouseEventSource args_8,bool args_9,QPointingDevice *args_10)

{
  long lVar1;
  QPointF args_3_00;
  QPointF args_2_00;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  QFlags<Qt::KeyboardModifier> in_ECX;
  QFlags<Qt::MouseButton> in_EDX;
  unsigned_long in_RSI;
  QWindow *in_RDI;
  MouseButton in_R8D;
  Type in_R9D;
  long in_FS_OFFSET;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  qreal in_XMM2_Qa;
  qreal in_XMM3_Qa;
  undefined4 in_stack_00000008;
  undefined1 in_stack_00000010;
  QWindow *in_stack_00000018;
  MouseEvent event;
  ProcessEventsFlag in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb4;
  undefined8 in_stack_fffffffffffffeb8;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffedc;
  QFlagsStorage<Qt::KeyboardModifier> in_stack_fffffffffffffee8;
  undefined3 in_stack_fffffffffffffeec;
  QFlagsStorage<Qt::MouseButton> state;
  MouseButton in_stack_ffffffffffffff08;
  QFlagsStorage<QEventLoop::ProcessEventsFlag> in_stack_ffffffffffffff0c;
  Type in_stack_ffffffffffffff10;
  MouseEventSource in_stack_ffffffffffffff18;
  QPointingDevice *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  undefined1 local_c0 [16];
  byte local_b0;
  MouseEventSource in_stack_ffffffffffffff60;
  QPointingDevice *in_stack_ffffffffffffff70;
  
  uVar5 = (undefined4)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  state.i = CONCAT13(in_stack_00000010,in_stack_fffffffffffffeec) & 0x1ffffff;
  uVar4 = QThread::isMainThread();
  if ((uVar4 & 1) == 0) {
    uVar3 = (uint)(SUB41(state.i,3) & 1);
    args_2_00.yp._0_4_ = (int)in_XMM1_Qa;
    args_2_00.xp = (qreal)in_XMM0_Qa;
    args_2_00.yp._4_4_ = (int)((ulong)in_XMM1_Qa >> 0x20);
    args_3_00.yp = in_XMM3_Qa;
    args_3_00.xp = in_XMM2_Qa;
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::MouseEvent,QWindow*,unsigned_long,QPointF,QPointF,QFlags<Qt::MouseButton>,QFlags<Qt::KeyboardModifier>,Qt::MouseButton,QEvent::Type,Qt::MouseEventSource,bool,QPointingDevice_const*>
              (in_RDI,in_RSI,args_2_00,args_3_00,in_EDX,in_ECX,in_R8D,in_R9D,
               in_stack_ffffffffffffff60,SUB41(state.i,3),in_stack_ffffffffffffff70);
    QFlags<QEventLoop::ProcessEventsFlag>::QFlags
              ((QFlags<QEventLoop::ProcessEventsFlag> *)CONCAT44(in_stack_fffffffffffffeb4,uVar3),
               in_stack_fffffffffffffeac);
    bVar2 = QWindowSystemInterface::flushWindowSystemEvents
                      ((ProcessEventsFlags)in_stack_ffffffffffffff0c.i);
    goto LAB_0044b2f8;
  }
  memcpy(local_c0,&DAT_00ba3c58,0x78);
  uVar3 = (uint)((byte)(state.i >> 0x18) & 1);
  QWindowSystemInterfacePrivate::MouseEvent::MouseEvent
            ((MouseEvent *)CONCAT44(in_stack_fffffffffffffedc,0xffffffff),in_stack_00000018,
             CONCAT44(in_stack_fffffffffffffecc,uVar3),
             (QPointF *)CONCAT44(in_stack_fffffffffffffec4,in_stack_00000008),
             (QPointF *)CONCAT44(uVar5,in_R9D),(MouseButtons)state.i,
             (KeyboardModifiers)in_stack_fffffffffffffee8.i,in_stack_ffffffffffffff08,
             in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
             SUB41((uint)in_stack_fffffffffffffeb4 >> 0x18,0),in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff30);
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent
              ((WindowSystemEvent *)CONCAT44(in_stack_fffffffffffffecc,uVar3));
LAB_0044b1fc:
    bVar2 = local_b0 & 1;
  }
  else {
    uVar3 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,local_c0);
    if ((uVar3 & 1) != 0) goto LAB_0044b1fc;
    bVar2 = 0;
  }
  QWindowSystemInterfacePrivate::MouseEvent::~MouseEvent((MouseEvent *)0x44b21e);
LAB_0044b2f8:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}